

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void ts_lexer__get_lookahead(Lexer *self)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  code *pcVar4;
  DecodeFunction decode;
  uint32_t size;
  uint8_t *chunk;
  uint32_t position_in_chunk;
  Lexer *self_local;
  
  uVar1 = (self->current_position).bytes - self->chunk_start;
  uVar2 = self->chunk_size - uVar1;
  if (uVar2 == 0) {
    self->lookahead_size = 1;
    (self->data).lookahead = 0;
  }
  else {
    pcVar4 = utf16_iterate;
    if ((self->input).encoding == TSInputEncodingUTF8) {
      pcVar4 = utf8proc_iterate;
    }
    uVar3 = (*pcVar4)(self->chunk + uVar1,uVar2,self);
    self->lookahead_size = uVar3;
    if (((self->data).lookahead == -1) && (uVar2 < 4)) {
      ts_lexer__get_chunk(self);
      uVar3 = (*pcVar4)(self->chunk,self->chunk_size,self);
      self->lookahead_size = uVar3;
    }
    if ((self->data).lookahead == -1) {
      self->lookahead_size = 1;
    }
  }
  return;
}

Assistant:

static void ts_lexer__get_lookahead(Lexer *self) {
  uint32_t position_in_chunk = self->current_position.bytes - self->chunk_start;
  const uint8_t *chunk = (const uint8_t *)self->chunk + position_in_chunk;
  uint32_t size = self->chunk_size - position_in_chunk;

  if (size == 0) {
    self->lookahead_size = 1;
    self->data.lookahead = '\0';
    return;
  }

  DecodeFunction decode =
    self->input.encoding == TSInputEncodingUTF8 ? utf8proc_iterate : utf16_iterate;

  self->lookahead_size = decode(chunk, size, &self->data.lookahead);

  // If this chunk ended in the middle of a multi-byte character,
  // try again with a fresh chunk.
  if (self->data.lookahead == -1 && size < 4) {
    ts_lexer__get_chunk(self);
    chunk = (const uint8_t *)self->chunk;
    size = self->chunk_size;
    self->lookahead_size = decode(chunk, size, &self->data.lookahead);
  }

  if (self->data.lookahead == -1) {
    self->lookahead_size = 1;
  }
}